

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O0

bool __thiscall irr::scene::CB3DMeshFileLoader::load(CB3DMeshFileLoader *this)

{
  vector<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_> *pvVar1;
  bool bVar2;
  int iVar3;
  SB3dChunk *pSVar4;
  long lVar5;
  ulong uVar6;
  long in_RDI;
  double __x;
  double __x_00;
  CB3DMeshFileLoader *in_stack_00000020;
  s32 fileVersion;
  SB3dChunkHeader header;
  CB3DMeshFileLoader *in_stack_00000110;
  SJoint *in_stack_000001c0;
  CB3DMeshFileLoader *in_stack_000001c8;
  SB3dChunk *in_stack_ffffffffffffff78;
  array<irr::scene::SB3dChunk> *in_stack_ffffffffffffff80;
  SB3dChunkHeader *in_stack_ffffffffffffff88;
  array<int> *in_stack_ffffffffffffff90;
  u32 index;
  array<irr::scene::SB3dChunk> *this_00;
  undefined1 local_2c [20];
  char local_18 [24];
  
  core::array<irr::scene::SB3dChunk>::clear
            ((array<irr::scene::SB3dChunk> *)in_stack_ffffffffffffff90);
  *(undefined1 *)(in_RDI + 0xdc) = 0;
  *(undefined1 *)(in_RDI + 0xdd) = 0;
  (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),local_18,8);
  iVar3 = strncmp(local_18,"BB3D",4);
  if (iVar3 == 0) {
    (**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
    SB3dChunk::SB3dChunk
              ((SB3dChunk *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               (long)in_stack_ffffffffffffff80);
    core::array<irr::scene::SB3dChunk>::push_back
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    (**(code **)**(undefined8 **)(in_RDI + 0xd0))(*(undefined8 **)(in_RDI + 0xd0),local_2c,4);
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                               ((array<irr::scene::SB3dChunk> *)0x2cd212);
            this_00 = (array<irr::scene::SB3dChunk> *)pSVar4->startposition;
            pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                               ((array<irr::scene::SB3dChunk> *)0x2cd229);
            iVar3 = pSVar4->length;
            pvVar1 = &this_00->m_data;
            lVar5 = (**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
            if ((long)&(pvVar1->
                       super__Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>
                       )._M_impl.super__Vector_impl_data._M_start + (long)iVar3 <= lVar5) {
              core::array<irr::scene::SB3dChunk>::clear
                        ((array<irr::scene::SB3dChunk> *)in_stack_ffffffffffffff90);
              core::array<irr::video::S3DVertex2TCoords>::clear
                        ((array<irr::video::S3DVertex2TCoords> *)in_stack_ffffffffffffff90);
              core::array<int>::clear(in_stack_ffffffffffffff90);
              core::array<int>::clear(in_stack_ffffffffffffff90);
              core::array<irr::scene::SB3dMaterial>::clear
                        ((array<irr::scene::SB3dMaterial> *)in_stack_ffffffffffffff90);
              core::array<irr::scene::SB3dTexture>::clear
                        ((array<irr::scene::SB3dTexture> *)in_stack_ffffffffffffff90);
              return true;
            }
            (**(code **)**(undefined8 **)(in_RDI + 0xd0))
                      (*(undefined8 **)(in_RDI + 0xd0),local_18,8);
            index = (u32)((ulong)(in_RDI + 8) >> 0x20);
            (**(code **)(**(long **)(in_RDI + 0xd0) + 0x18))();
            SB3dChunk::SB3dChunk
                      ((SB3dChunk *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                       (long)in_stack_ffffffffffffff80);
            core::array<irr::scene::SB3dChunk>::push_back
                      (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                               ((array<irr::scene::SB3dChunk> *)0x2cd2cc);
            iVar3 = strncmp(pSVar4->name,"TEXS",4);
            if (iVar3 != 0) break;
            bVar2 = readChunkTEXS(in_stack_00000020);
            if (!bVar2) {
              return false;
            }
          }
          pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                             ((array<irr::scene::SB3dChunk> *)0x2cd313);
          iVar3 = strncmp(pSVar4->name,"BRUS",4);
          if (iVar3 != 0) break;
          bVar2 = readChunkBRUS(in_stack_00000110);
          if (!bVar2) {
            return false;
          }
        }
        pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                           ((array<irr::scene::SB3dChunk> *)0x2cd35a);
        iVar3 = strncmp(pSVar4->name,"NODE",4);
        if (iVar3 == 0) break;
        os::Printer::log((Printer *)"Unknown chunk found in mesh base - skipping",__x_00);
        in_stack_ffffffffffffff90 = *(array<int> **)(in_RDI + 0xd0);
        pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                           ((array<irr::scene::SB3dChunk> *)0x2cd3c2);
        in_stack_ffffffffffffff88 = (SB3dChunkHeader *)pSVar4->startposition;
        pSVar4 = core::array<irr::scene::SB3dChunk>::getLast
                           ((array<irr::scene::SB3dChunk> *)0x2cd3d9);
        uVar6 = (*(code *)((((_Vector_base<irr::scene::SB3dChunk,_std::allocator<irr::scene::SB3dChunk>_>
                              *)&(in_stack_ffffffffffffff90->m_data).
                                 super__Vector_base<int,_std::allocator<int>_>)->_M_impl).
                           super__Vector_impl_data._M_start)->startposition)
                          (in_stack_ffffffffffffff90,
                           in_stack_ffffffffffffff88->name + pSVar4->length,0);
        if ((uVar6 & 1) == 0) {
          return false;
        }
        in_stack_ffffffffffffff80 = (array<irr::scene::SB3dChunk> *)(in_RDI + 8);
        core::array<irr::scene::SB3dChunk>::size((array<irr::scene::SB3dChunk> *)0x2cd41d);
        core::array<irr::scene::SB3dChunk>::erase(this_00,index);
      }
      bVar2 = readChunkNODE(in_stack_000001c8,in_stack_000001c0);
    } while (bVar2);
  }
  else {
    __x = (double)(**(code **)(**(long **)(in_RDI + 0xd0) + 0x20))();
    os::Printer::log(__x);
  }
  return false;
}

Assistant:

bool CB3DMeshFileLoader::load()
{
	B3dStack.clear();

	NormalsInFile = false;
	HasVertexColors = false;

	//------ Get header ------

	SB3dChunkHeader header;
	B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
	header.size = os::Byteswap::byteswap(header.size);
#endif

	if (strncmp(header.name, "BB3D", 4) != 0) {
		os::Printer::log("File is not a b3d file. Loading failed (No header found)", B3DFile->getFileName(), ELL_ERROR);
		return false;
	}

	// Add main chunk...
	B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

	// Get file version, but ignore it, as it's not important with b3d files...
	s32 fileVersion;
	B3DFile->read(&fileVersion, sizeof(fileVersion));
#ifdef __BIG_ENDIAN__
	fileVersion = os::Byteswap::byteswap(fileVersion);
#endif

	//------ Read main chunk ------

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) {
		B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
		header.size = os::Byteswap::byteswap(header.size);
#endif
		B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

		if (strncmp(B3dStack.getLast().name, "TEXS", 4) == 0) {
			if (!readChunkTEXS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "BRUS", 4) == 0) {
			if (!readChunkBRUS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "NODE", 4) == 0) {
			if (!readChunkNODE((CSkinnedMesh::SJoint *)0))
				return false;
		} else {
			os::Printer::log("Unknown chunk found in mesh base - skipping");
			if (!B3DFile->seek(B3dStack.getLast().startposition + B3dStack.getLast().length))
				return false;
			B3dStack.erase(B3dStack.size() - 1);
		}
	}

	B3dStack.clear();

	BaseVertices.clear();
	AnimatedVertices_VertexID.clear();
	AnimatedVertices_BufferID.clear();

	Materials.clear();
	Textures.clear();

	return true;
}